

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError parse_time_cond(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  curl_off_t cStack_30;
  int rc;
  curl_off_t value;
  char *pcStack_20;
  ParameterError err;
  char *nextarg_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  
  value._4_4_ = PARAM_OK;
  cVar1 = *nextarg;
  if (cVar1 == '+') {
    pcStack_20 = nextarg + 1;
  }
  else {
    if (cVar1 == '-') {
      config->timecond = 2;
      pcStack_20 = nextarg + 1;
      goto LAB_00116725;
    }
    pcStack_20 = nextarg;
    if (cVar1 == '=') {
      config->timecond = 3;
      pcStack_20 = nextarg + 1;
      goto LAB_00116725;
    }
  }
  config->timecond = 1;
LAB_00116725:
  nextarg_local = (char *)config;
  config_local = (OperationConfig *)global;
  uVar3 = curl_getdate(pcStack_20,0);
  *(undefined8 *)(nextarg_local + 0x3c8) = uVar3;
  if (*(long *)(nextarg_local + 0x3c8) == -1) {
    iVar2 = getfiletime(pcStack_20,(GlobalConfig *)config_local,&stack0xffffffffffffffd0);
    if (iVar2 == 0) {
      *(curl_off_t *)(nextarg_local + 0x3c8) = cStack_30;
    }
    else {
      nextarg_local[0x4b8] = '\0';
      nextarg_local[0x4b9] = '\0';
      nextarg_local[0x4ba] = '\0';
      nextarg_local[0x4bb] = '\0';
      nextarg_local[0x4bc] = '\0';
      nextarg_local[0x4bd] = '\0';
      nextarg_local[0x4be] = '\0';
      nextarg_local[0x4bf] = '\0';
      warnf((GlobalConfig *)config_local,
            "Illegal date format for -z, --time-cond (and not a filename). Disabling time condition. See curl_getdate(3) for valid date syntax."
           );
    }
  }
  return value._4_4_;
}

Assistant:

static ParameterError parse_time_cond(struct GlobalConfig *global,
                                      struct OperationConfig *config,
                                      const char *nextarg)
{
  ParameterError err = PARAM_OK;

  switch(*nextarg) {
  case '+':
    nextarg++;
    FALLTHROUGH();
  default:
    /* If-Modified-Since: (section 14.28 in RFC2068) */
    config->timecond = CURL_TIMECOND_IFMODSINCE;
    break;
  case '-':
    /* If-Unmodified-Since:  (section 14.24 in RFC2068) */
    config->timecond = CURL_TIMECOND_IFUNMODSINCE;
    nextarg++;
    break;
  case '=':
    /* Last-Modified:  (section 14.29 in RFC2068) */
    config->timecond = CURL_TIMECOND_LASTMOD;
    nextarg++;
    break;
  }
  config->condtime = (curl_off_t)curl_getdate(nextarg, NULL);
  if(-1 == config->condtime) {
    curl_off_t value;
    /* now let's see if it is a filename to get the time from instead! */
    int rc = getfiletime(nextarg, global, &value);
    if(!rc)
      /* pull the time out from the file */
      config->condtime = value;
    else {
      /* failed, remove time condition */
      config->timecond = CURL_TIMECOND_NONE;
      warnf(global,
            "Illegal date format for -z, --time-cond (and not "
            "a filename). Disabling time condition. "
            "See curl_getdate(3) for valid date syntax.");
    }
  }
  return err;
}